

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          (InputArchive<cereal::PortableBinaryInputArchive,_1U> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,int *tail_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_2)

{
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_RCX;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  process<std::__cxx11::string&>(in_RDI,in_stack_ffffffffffffffc8);
  process<std::__cxx11::string&,int&,std::__cxx11::string&>
            (in_RCX,in_R8,(int *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }